

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O3

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::TaggedUnionExpression>
          (ConstraintExprVisitor *this,TaggedUnionExpression *expr)

{
  int iVar1;
  Expression *this_00;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> pSVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  RandMode RVar7;
  ExpressionKind EVar8;
  SubroutineKind SVar9;
  Symbol *pSVar10;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar11;
  byte bVar12;
  SourceLocation SVar13;
  long lVar15;
  DiagCode code;
  ASTContext *this_01;
  BinaryExpression *binExpr;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_30;
  uint local_28;
  byte local_23;
  SourceLocation SVar14;
  
  if ((this->failed != false) || (bVar5 = Expression::bad(&expr->super_Expression), bVar5))
  goto LAB_0030de69;
  pSVar10 = Expression::getSymbolReference(&expr->super_Expression,true);
  if ((pSVar10 != (Symbol *)0x0) &&
     (((RVar7 = ASTContext::getRandMode(this->context,pSVar10), RVar7 != None &&
       (this->sawRandVars = true, RVar7 == RandC)) && (this->isSoft != false)))) {
    ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
  }
  EVar8 = (expr->super_Expression).kind;
  if ((EVar8 < Conversion) && ((0x340000U >> (EVar8 & ValueRange) & 1) != 0)) {
    bVar12 = 0;
  }
  else {
    bVar5 = this->isTop;
    bVar6 = this->sawRandVars;
    this->isTop = false;
    this->sawRandVars = false;
    this_00 = expr->valueExpr;
    if (this_00 == (Expression *)0x0) {
      bVar12 = 0;
    }
    else {
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::ConstraintExprVisitor&>
                (this_00,this_00,this);
      bVar12 = this->sawRandVars;
      EVar8 = (expr->super_Expression).kind;
    }
    this->isTop = bVar5;
    this->sawRandVars = bVar6;
  }
  bVar5 = true;
  switch(EVar8) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&local_30,(SVIntStorage *)&expr->valueExpr);
    goto LAB_0030dd5c;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    if (0 < (int)(((this_01->scope).ptr)->compilation->options).languageVersion) break;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_0030dc94;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&local_30);
LAB_0030dd5c:
    if ((0x40 < local_28 || (local_23 & 1) != 0) && ((void *)local_30.val != (void *)0x0)) {
      operator_delete__(local_30.pVal);
    }
    if ((local_23 & 1) == 0) {
      return true;
    }
    this_01 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_0030dc94;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    EVar8 = expr[1].super_Expression.kind;
    if (EVar8 < DataType) {
      if ((0x79e600U >> (EVar8 & ValueRange) & 1) == 0) {
        if ((0x61800U >> (EVar8 & ValueRange) & 1) != 0) goto switchD_0030dc44_caseD_11;
      }
      else if (((bVar12 & 1) != 0) &&
              ((((expr->member->kind & ~IntegerLiteral) == NamedValue &&
                (bVar6 = checkType(this,(Expression *)expr->member), !bVar6)) ||
               (((expr->valueExpr->kind & ~IntegerLiteral) == NamedValue &&
                (bVar6 = checkType(this,expr->valueExpr), !bVar6)))))) goto LAB_0030de69;
    }
    break;
  case Streaming:
switchD_0030dc44_caseD_11:
    this_01 = this->context;
    SVar14 = (expr->super_Expression).sourceRange.startLoc;
    SVar13 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_0030dc94:
    sourceRange.endLoc = SVar13;
    sourceRange.startLoc = SVar14;
    ASTContext::addDiag(this_01,code,sourceRange);
    goto LAB_0030de69;
  case Call:
    SVar9 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar9 == Task) {
      this_01 = this->context;
      SVar14 = (expr->super_Expression).sourceRange.startLoc;
      SVar13 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_0030dc94;
    }
    if (*(char *)&expr[1].super_Expression.sourceRange.startLoc != '\x01') {
      ppSVar11 = std::
                 get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                           ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                             *)&expr->member);
      pSVar2 = *ppSVar11;
      if ((pSVar2->super_Scope).deferredMemberIndex != Invalid) {
        Scope::elaborate(&pSVar2->super_Scope);
      }
      sVar3 = (pSVar2->arguments)._M_extent._M_extent_value;
      if (sVar3 != 0) {
        lVar15 = 0;
        do {
          lVar4 = *(long *)((long)(pSVar2->arguments)._M_ptr + lVar15);
          iVar1 = *(int *)(lVar4 + 0x158);
          if (iVar1 == 3) {
            if ((*(byte *)(lVar4 + 0x154) & 1) == 0) goto LAB_0030de7c;
          }
          else if (iVar1 - 1U < 2) {
LAB_0030de7c:
            this_01 = this->context;
            SVar14 = (expr->super_Expression).sourceRange.startLoc;
            SVar13 = (expr->super_Expression).sourceRange.endLoc;
            code.subsystem = Statements;
            code.code = 0x32;
            goto LAB_0030dc94;
          }
          lVar15 = lVar15 + 8;
        } while (sVar3 << 3 != lVar15);
      }
    }
    break;
  default:
    switch(EVar8) {
    case ValueRange:
      return true;
    case Dist:
      local_30 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)this->context;
      local_28 = local_28 & 0xffffff00;
      pSVar10 = expr->member;
      Expression::visitExpression<slang::ast::Expression_const,slang::ast::DistVarVisitor&>
                ((Expression *)pSVar10,(Expression *)pSVar10,(DistVarVisitor *)&local_30);
      if ((char)local_28 != '\0') {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x3c0008,*(SourceRange *)&pSVar10->parentScope);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_0030dc44_caseD_11;
    }
  }
  bVar6 = checkType(this,&expr->super_Expression);
  if (!bVar6) {
LAB_0030de69:
    this->failed = true;
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }